

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O0

int Test_SUNLinSolResid(SUNLinearSolver S,int myid)

{
  long lVar1;
  uint in_ESI;
  undefined8 in_RDI;
  double dVar2;
  double dVar3;
  N_Vector resid;
  double stop_time;
  double start_time;
  int local_4;
  
  dVar2 = get_time();
  lVar1 = SUNLinSolResid(in_RDI);
  sync_device();
  dVar3 = get_time();
  if (lVar1 == 0) {
    printf(">>> FAILED test -- SUNLinSolResid returned NULL N_Vector on Proc %d \n",(ulong)in_ESI);
    local_4 = 1;
  }
  else {
    if ((in_ESI == 0) && (printf("    PASSED test -- SUNLinSolResid\n"), print_time != 0)) {
      printf("    SUNLinSolResid Time: %22.15e \n \n",dVar3 - dVar2);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Test_SUNLinSolResid(SUNLinearSolver S, int myid)
{
  double start_time, stop_time;
  N_Vector resid;

  /* this test can fail if the function returns NULL */
  start_time = get_time();
  resid      = SUNLinSolResid(S);
  sync_device();
  stop_time = get_time();

  /* this test can also fail if the return value is NULL */
  if (resid == NULL)
  {
    printf(">>> FAILED test -- SUNLinSolResid returned NULL N_Vector on Proc "
           "%d \n",
           myid);
    return (1);
  }
  else if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolResid\n");
    PRINT_TIME("    SUNLinSolResid Time: %22.15e \n \n", stop_time - start_time);
  }

  return (0);
}